

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Rendering.cpp
# Opt level: O2

void __thiscall Assimp::X3DImporter::ParseNode_Rendering_PointSet(X3DImporter *this)

{
  FIReader *pFVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  CX3DImporter_NodeElement_IndexedSet *this_00;
  list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_> *this_01;
  uint uVar5;
  string *psVar6;
  allocator<char> local_99;
  CX3DImporter_NodeElement *ne;
  string an;
  string def;
  string use;
  
  use._M_dataplus._M_p = (pointer)&use.field_2;
  use._M_string_length = 0;
  def._M_dataplus._M_p = (pointer)&def.field_2;
  def._M_string_length = 0;
  uVar5 = 0;
  ne = (CX3DImporter_NodeElement *)0x0;
  use.field_2._M_local_buf[0] = '\0';
  def.field_2._M_local_buf[0] = '\0';
  uVar3 = (*(((this->mReader)._M_t.
              super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
              super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
              super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
            super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[4])();
  if ((int)uVar3 < 1) {
    uVar3 = 0;
  }
  for (; uVar3 != uVar5; uVar5 = uVar5 + 1) {
    pFVar1 = (this->mReader)._M_t.
             super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
             super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
             super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
    iVar4 = (*(pFVar1->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[5])
                      (pFVar1,(ulong)uVar5);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&an,(char *)CONCAT44(extraout_var,iVar4),&local_99);
    bVar2 = std::operator==(&an,"DEF");
    if (bVar2) {
      pFVar1 = (this->mReader)._M_t.
               super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
               super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
               super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
      (*(pFVar1->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                (pFVar1,(ulong)uVar5);
      psVar6 = &def;
LAB_00553e8c:
      std::__cxx11::string::assign((char *)psVar6);
    }
    else {
      bVar2 = std::operator==(&an,"USE");
      if (bVar2) {
        pFVar1 = (this->mReader)._M_t.
                 super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
                 super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
        (*(pFVar1->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                  (pFVar1,(ulong)uVar5);
        psVar6 = &use;
        goto LAB_00553e8c;
      }
      bVar2 = std::operator==(&an,"bboxCenter");
      if (((!bVar2) && (bVar2 = std::operator==(&an,"bboxSize"), !bVar2)) &&
         (bVar2 = std::operator==(&an,"containerField"), !bVar2)) {
        Throw_IncorrectAttr(this,&an);
      }
    }
    std::__cxx11::string::~string((string *)&an);
  }
  if (use._M_string_length == 0) {
    this_00 = (CX3DImporter_NodeElement_IndexedSet *)operator_new(0xf0);
    CX3DImporter_NodeElement_IndexedSet::CX3DImporter_NodeElement_IndexedSet
              (this_00,ENET_PointSet,this->NodeElement_Cur);
    ne = (CX3DImporter_NodeElement *)this_00;
    if (def._M_string_length != 0) {
      std::__cxx11::string::_M_assign
                ((string *)
                 &(this_00->super_CX3DImporter_NodeElement_Geometry3D).
                  super_CX3DImporter_NodeElement.ID);
    }
    iVar4 = (*(((this->mReader)._M_t.
                super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t
                .super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
                super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
              super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xf])();
    if ((char)iVar4 == '\0') {
      ParseHelper_Node_Enter(this,ne);
      do {
        do {
          while( true ) {
            iVar4 = (*(((this->mReader)._M_t.
                        super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                        .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                      super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[2])();
            if ((char)iVar4 == '\0') {
              std::__cxx11::string::string<std::allocator<char>>((string *)&an,"PointSet",&local_99)
              ;
              Throw_CloseNotFound(this,&an);
              std::__cxx11::string::~string((string *)&an);
              goto LAB_00554141;
            }
            iVar4 = (*(((this->mReader)._M_t.
                        super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                        .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                      super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[3])();
            if (iVar4 != 1) break;
            std::__cxx11::string::string<std::allocator<char>>((string *)&an,"Color",&local_99);
            bVar2 = XML_CheckNode_NameEqual(this,&an);
            std::__cxx11::string::~string((string *)&an);
            if (bVar2) {
              ParseNode_Rendering_Color(this);
            }
            else {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&an,"ColorRGBA",&local_99);
              bVar2 = XML_CheckNode_NameEqual(this,&an);
              std::__cxx11::string::~string((string *)&an);
              if (bVar2) {
                ParseNode_Rendering_ColorRGBA(this);
              }
              else {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&an,"Coordinate",&local_99);
                bVar2 = XML_CheckNode_NameEqual(this,&an);
                std::__cxx11::string::~string((string *)&an);
                if (bVar2) {
                  ParseNode_Rendering_Coordinate(this);
                }
                else {
                  bVar2 = ParseHelper_CheckRead_X3DMetadataObject(this);
                  if (!bVar2) {
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&an,"PointSet",&local_99);
                    XML_CheckNode_SkipUnsupported(this,&an);
                    std::__cxx11::string::~string((string *)&an);
                  }
                }
              }
            }
          }
          iVar4 = (*(((this->mReader)._M_t.
                      super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                      .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                    super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[3])();
        } while (iVar4 != 2);
        std::__cxx11::string::string<std::allocator<char>>((string *)&an,"PointSet",&local_99);
        bVar2 = XML_CheckNode_NameEqual(this,&an);
        std::__cxx11::string::~string((string *)&an);
      } while (!bVar2);
LAB_00554141:
      ParseHelper_Node_Exit(this);
    }
    else {
      std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
      push_back(&this->NodeElement_Cur->Child,&ne);
    }
    this_01 = &this->NodeElement_List;
  }
  else {
    XML_CheckNode_MustBeEmpty(this);
    if (def._M_string_length != 0) {
      Throw_DEF_And_USE(this);
    }
    bVar2 = FindNodeElement(this,&use,ENET_PointSet,&ne);
    if (!bVar2) {
      Throw_USE_NotFound(this,&use);
    }
    this_01 = &this->NodeElement_Cur->Child;
  }
  std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
  push_back(this_01,&ne);
  std::__cxx11::string::~string((string *)&def);
  std::__cxx11::string::~string((string *)&use);
  return;
}

Assistant:

void X3DImporter::ParseNode_Rendering_PointSet()
{
    std::string use, def;
    CX3DImporter_NodeElement* ne( nullptr );

	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECKUSEDEF_RET(def, use);
	MACRO_ATTRREAD_LOOPEND;

	// if "USE" defined then find already defined element.
	if(!use.empty())
	{
		MACRO_USE_CHECKANDAPPLY(def, use, ENET_PointSet, ne);
	}
	else
	{
		// create and if needed - define new geometry object.
		ne = new CX3DImporter_NodeElement_IndexedSet(CX3DImporter_NodeElement::ENET_PointSet, NodeElement_Cur);
		if(!def.empty()) ne->ID = def;

        // check for child nodes
        if(!mReader->isEmptyElement())
        {
			ParseHelper_Node_Enter(ne);
			MACRO_NODECHECK_LOOPBEGIN("PointSet");
				// check for X3DComposedGeometryNodes
				if(XML_CheckNode_NameEqual("Color")) { ParseNode_Rendering_Color(); continue; }
				if(XML_CheckNode_NameEqual("ColorRGBA")) { ParseNode_Rendering_ColorRGBA(); continue; }
				if(XML_CheckNode_NameEqual("Coordinate")) { ParseNode_Rendering_Coordinate(); continue; }
				// check for X3DMetadataObject
				if(!ParseHelper_CheckRead_X3DMetadataObject()) XML_CheckNode_SkipUnsupported("PointSet");

			MACRO_NODECHECK_LOOPEND("PointSet");
			ParseHelper_Node_Exit();
		}// if(!mReader->isEmptyElement())
		else
		{
			NodeElement_Cur->Child.push_back(ne);// add made object as child to current element
		}

		NodeElement_List.push_back(ne);// add element to node element list because its a new object in graph
	}// if(!use.empty()) else
}